

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

void av1_reset_cdf_symbol_counters(FRAME_CONTEXT *fc)

{
  aom_cdf_prob *in_RDI;
  int num_cdfs_73;
  int array_size_73;
  aom_cdf_prob *cdf_ptr_73;
  int num_cdfs_72;
  int array_size_72;
  aom_cdf_prob *cdf_ptr_72;
  int num_cdfs_71;
  int array_size_71;
  aom_cdf_prob *cdf_ptr_71;
  int num_cdfs_70;
  int array_size_70;
  aom_cdf_prob *cdf_ptr_70;
  int num_cdfs_69;
  int array_size_69;
  aom_cdf_prob *cdf_ptr_69;
  int num_cdfs_68;
  int array_size_68;
  aom_cdf_prob *cdf_ptr_68;
  int num_cdfs_67;
  int array_size_67;
  aom_cdf_prob *cdf_ptr_67;
  int num_cdfs_66;
  int array_size_66;
  aom_cdf_prob *cdf_ptr_66;
  int i_1;
  int num_cdfs_65;
  int array_size_65;
  aom_cdf_prob *cdf_ptr_65;
  int num_cdfs_64;
  int array_size_64;
  aom_cdf_prob *cdf_ptr_64;
  int num_cdfs_63;
  int array_size_63;
  aom_cdf_prob *cdf_ptr_63;
  int num_cdfs_62;
  int array_size_62;
  aom_cdf_prob *cdf_ptr_62;
  int num_cdfs_61;
  int array_size_61;
  aom_cdf_prob *cdf_ptr_61;
  int num_cdfs_60;
  int array_size_60;
  aom_cdf_prob *cdf_ptr_60;
  int num_cdfs_59;
  int array_size_59;
  aom_cdf_prob *cdf_ptr_59;
  int num_cdfs_58;
  int array_size_58;
  aom_cdf_prob *cdf_ptr_58;
  int num_cdfs_57;
  int array_size_57;
  aom_cdf_prob *cdf_ptr_57;
  int num_cdfs_56;
  int array_size_56;
  aom_cdf_prob *cdf_ptr_56;
  int num_cdfs_55;
  int array_size_55;
  aom_cdf_prob *cdf_ptr_55;
  int num_cdfs_54;
  int array_size_54;
  aom_cdf_prob *cdf_ptr_54;
  int i;
  int num_cdfs_53;
  int array_size_53;
  aom_cdf_prob *cdf_ptr_53;
  int num_cdfs_52;
  int array_size_52;
  aom_cdf_prob *cdf_ptr_52;
  int num_cdfs_51;
  int array_size_51;
  aom_cdf_prob *cdf_ptr_51;
  int num_cdfs_50;
  int array_size_50;
  aom_cdf_prob *cdf_ptr_50;
  int num_cdfs_49;
  int array_size_49;
  aom_cdf_prob *cdf_ptr_49;
  int num_cdfs_48;
  int array_size_48;
  aom_cdf_prob *cdf_ptr_48;
  int num_cdfs_47;
  int array_size_47;
  aom_cdf_prob *cdf_ptr_47;
  int num_cdfs_46;
  int array_size_46;
  aom_cdf_prob *cdf_ptr_46;
  int num_cdfs_45;
  int array_size_45;
  aom_cdf_prob *cdf_ptr_45;
  int num_cdfs_44;
  int array_size_44;
  aom_cdf_prob *cdf_ptr_44;
  int num_cdfs_43;
  int array_size_43;
  aom_cdf_prob *cdf_ptr_43;
  int num_cdfs_42;
  int array_size_42;
  aom_cdf_prob *cdf_ptr_42;
  int num_cdfs_41;
  int array_size_41;
  aom_cdf_prob *cdf_ptr_41;
  int num_cdfs_40;
  int array_size_40;
  aom_cdf_prob *cdf_ptr_40;
  int num_cdfs_39;
  int array_size_39;
  aom_cdf_prob *cdf_ptr_39;
  int num_cdfs_38;
  int array_size_38;
  aom_cdf_prob *cdf_ptr_38;
  int num_cdfs_37;
  int array_size_37;
  aom_cdf_prob *cdf_ptr_37;
  int num_cdfs_36;
  int array_size_36;
  aom_cdf_prob *cdf_ptr_36;
  int num_cdfs_35;
  int array_size_35;
  aom_cdf_prob *cdf_ptr_35;
  int num_cdfs_34;
  int array_size_34;
  aom_cdf_prob *cdf_ptr_34;
  int num_cdfs_33;
  int array_size_33;
  aom_cdf_prob *cdf_ptr_33;
  int num_cdfs_32;
  int array_size_32;
  aom_cdf_prob *cdf_ptr_32;
  int num_cdfs_31;
  int array_size_31;
  aom_cdf_prob *cdf_ptr_31;
  int num_cdfs_30;
  int array_size_30;
  aom_cdf_prob *cdf_ptr_30;
  int num_cdfs_29;
  int array_size_29;
  aom_cdf_prob *cdf_ptr_29;
  int num_cdfs_28;
  int array_size_28;
  aom_cdf_prob *cdf_ptr_28;
  int num_cdfs_27;
  int array_size_27;
  aom_cdf_prob *cdf_ptr_27;
  int nsymbs;
  int j;
  int num_cdfs_26;
  int array_size_26;
  aom_cdf_prob *cdf_ptr_26;
  int num_cdfs_25;
  int array_size_25;
  aom_cdf_prob *cdf_ptr_25;
  int num_cdfs_24;
  int array_size_24;
  aom_cdf_prob *cdf_ptr_24;
  int num_cdfs_23;
  int array_size_23;
  aom_cdf_prob *cdf_ptr_23;
  int num_cdfs_22;
  int array_size_22;
  aom_cdf_prob *cdf_ptr_22;
  int num_cdfs_21;
  int array_size_21;
  aom_cdf_prob *cdf_ptr_21;
  int num_cdfs_20;
  int array_size_20;
  aom_cdf_prob *cdf_ptr_20;
  int num_cdfs_19;
  int array_size_19;
  aom_cdf_prob *cdf_ptr_19;
  int num_cdfs_18;
  int array_size_18;
  aom_cdf_prob *cdf_ptr_18;
  int num_cdfs_17;
  int array_size_17;
  aom_cdf_prob *cdf_ptr_17;
  int num_cdfs_16;
  int array_size_16;
  aom_cdf_prob *cdf_ptr_16;
  int num_cdfs_15;
  int array_size_15;
  aom_cdf_prob *cdf_ptr_15;
  int num_cdfs_14;
  int array_size_14;
  aom_cdf_prob *cdf_ptr_14;
  int num_cdfs_13;
  int array_size_13;
  aom_cdf_prob *cdf_ptr_13;
  int num_cdfs_12;
  int array_size_12;
  aom_cdf_prob *cdf_ptr_12;
  int num_cdfs_11;
  int array_size_11;
  aom_cdf_prob *cdf_ptr_11;
  int num_cdfs_10;
  int array_size_10;
  aom_cdf_prob *cdf_ptr_10;
  int num_cdfs_9;
  int array_size_9;
  aom_cdf_prob *cdf_ptr_9;
  int num_cdfs_8;
  int array_size_8;
  aom_cdf_prob *cdf_ptr_8;
  int num_cdfs_7;
  int array_size_7;
  aom_cdf_prob *cdf_ptr_7;
  int num_cdfs_6;
  int array_size_6;
  aom_cdf_prob *cdf_ptr_6;
  int num_cdfs_5;
  int array_size_5;
  aom_cdf_prob *cdf_ptr_5;
  int num_cdfs_4;
  int array_size_4;
  aom_cdf_prob *cdf_ptr_4;
  int num_cdfs_3;
  int array_size_3;
  aom_cdf_prob *cdf_ptr_3;
  int num_cdfs_2;
  int array_size_2;
  aom_cdf_prob *cdf_ptr_2;
  int num_cdfs_1;
  int array_size_1;
  aom_cdf_prob *cdf_ptr_1;
  int num_cdfs;
  int array_size;
  aom_cdf_prob *cdf_ptr;
  int local_43c;
  nmv_context *in_stack_fffffffffffffbd0;
  int local_374;
  int local_1bc;
  
  reset_cdf_symbol_counter(in_RDI,0x41,3,2);
  reset_cdf_symbol_counter(in_RDI + 0xc3,0x5a,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1d1,6,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1e3,4,6,5);
  reset_cdf_symbol_counter(in_RDI + 0x1fb,4,7,6);
  reset_cdf_symbol_counter(in_RDI + 0x217,4,8,7);
  reset_cdf_symbol_counter(in_RDI + 0x237,4,9,8);
  reset_cdf_symbol_counter(in_RDI + 0x25b,4,10,9);
  reset_cdf_symbol_counter(in_RDI + 0x283,4,0xb,10);
  reset_cdf_symbol_counter(in_RDI + 0x2af,4,0xc,0xb);
  reset_cdf_symbol_counter(in_RDI + 0x2df,0x28,4,3);
  reset_cdf_symbol_counter(in_RDI + 0x37f,0x1a4,5,4);
  reset_cdf_symbol_counter(in_RDI + 0xbb3,0xd2,5,4);
  reset_cdf_symbol_counter(in_RDI + 0xfcd,6,3,2);
  reset_cdf_symbol_counter(in_RDI + 0xfdf,2,3,2);
  reset_cdf_symbol_counter(in_RDI + 0xfe5,6,3,2);
  reset_cdf_symbol_counter(in_RDI + 0xff7,3,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1000,8,9,8);
  reset_cdf_symbol_counter(in_RDI + 0x1048,0x16,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x108a,0x16,0x11,0x10);
  reset_cdf_symbol_counter(in_RDI + 0x1200,4,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x120c,0x16,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x124e,4,5,4);
  reset_cdf_symbol_counter(in_RDI + 0x1262,0x16,4,3);
  reset_cdf_symbol_counter(in_RDI + 0x12ba,0x16,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x12fc,7,8,7);
  reset_cdf_symbol_counter(in_RDI + 0x1334,7,8,7);
  for (local_1bc = 0; local_1bc < 7; local_1bc = local_1bc + 1) {
    reset_cdf_symbol_counter(in_RDI + (long)local_1bc * 0x2d + 0x136c,5,9,local_1bc + 2);
    reset_cdf_symbol_counter(in_RDI + (long)local_1bc * 0x2d + 0x14a7,5,9,local_1bc + 2);
  }
  reset_cdf_symbol_counter(in_RDI + 0x15e2,0x15,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1621,2,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1627,5,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1636,0x12,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x166c,5,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x167b,9,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1696,9,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x16b1,6,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x16c3,0x15,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1702,6,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1714,6,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1726,3,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x172f,3,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1738,4,3,2);
  reset_nmv_counter(in_stack_fffffffffffffbd0);
  reset_nmv_counter(in_stack_fffffffffffffbd0);
  reset_cdf_symbol_counter(in_RDI + 0x1862,1,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x1865,3,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x186e,3,9,8);
  reset_cdf_symbol_counter(in_RDI + 0x1889,0x16,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x18cb,1,6,5);
  reset_cdf_symbol_counter(in_RDI + 0x18d1,1,4,3);
  reset_cdf_symbol_counter(in_RDI + 0x18d5,1,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x18d8,1,3,2);
  reset_cdf_symbol_counter(in_RDI + 0x18db,4,0xe,0xd);
  reset_cdf_symbol_counter(in_RDI + 0x1913,0xd,0xf,0xd);
  reset_cdf_symbol_counter(in_RDI + 0x19d6,0xd,0xf,0xe);
  for (local_374 = 0; local_374 < 0x14; local_374 = local_374 + 1) {
    if (local_374 < 4) {
      reset_cdf_symbol_counter(in_RDI + (long)local_374 * 0xb + 0x1a99,1,0xb,4);
    }
    else if (local_374 < 0x10) {
      reset_cdf_symbol_counter(in_RDI + (long)local_374 * 0xb + 0x1a99,1,0xb,10);
    }
    else {
      reset_cdf_symbol_counter(in_RDI + (long)local_374 * 0xb + 0x1a99,1,0xb,8);
    }
  }
  reset_cdf_symbol_counter(in_RDI + 0x1b75,0x10,4,3);
  reset_cdf_symbol_counter(in_RDI + 0x1bb5,0x19,0xe,0xd);
  reset_cdf_symbol_counter(in_RDI + 0x1d13,8,8,7);
  reset_cdf_symbol_counter(in_RDI + 0x1d53,3,4,2);
  reset_cdf_symbol_counter(in_RDI + 0x1d5f,3,4,3);
  reset_cdf_symbol_counter(in_RDI + 0x1d6b,3,4,3);
  reset_cdf_symbol_counter(in_RDI + 0x1d77,3,4,3);
  reset_cdf_symbol_counter(in_RDI + 0x1d83,1,5,4);
  reset_cdf_symbol_counter(in_RDI + 0x1d9c,1,5,4);
  for (local_43c = 0; local_43c < 4; local_43c = local_43c + 1) {
    reset_cdf_symbol_counter(in_RDI + (long)local_43c * 5 + 0x1d88,1,5,4);
  }
  reset_cdf_symbol_counter(in_RDI + 0x2115,0x34,0x11,7);
  reset_cdf_symbol_counter(in_RDI + 0x2489,0x34,0x11,5);
  reset_cdf_symbol_counter(in_RDI + 0x2841,4,0x11,0x10);
  reset_cdf_symbol_counter(in_RDI + 0x2885,4,0x11,0xc);
  reset_cdf_symbol_counter(in_RDI + 0x28c9,4,0x11,2);
  reset_cdf_symbol_counter(in_RDI + 0x290d,1,9,8);
  reset_cdf_symbol_counter(in_RDI + 0x2916,6,0x11,0x10);
  return;
}

Assistant:

void av1_reset_cdf_symbol_counters(FRAME_CONTEXT *fc) {
  RESET_CDF_COUNTER(fc->txb_skip_cdf, 2);
  RESET_CDF_COUNTER(fc->eob_extra_cdf, 2);
  RESET_CDF_COUNTER(fc->dc_sign_cdf, 2);
  RESET_CDF_COUNTER(fc->eob_flag_cdf16, 5);
  RESET_CDF_COUNTER(fc->eob_flag_cdf32, 6);
  RESET_CDF_COUNTER(fc->eob_flag_cdf64, 7);
  RESET_CDF_COUNTER(fc->eob_flag_cdf128, 8);
  RESET_CDF_COUNTER(fc->eob_flag_cdf256, 9);
  RESET_CDF_COUNTER(fc->eob_flag_cdf512, 10);
  RESET_CDF_COUNTER(fc->eob_flag_cdf1024, 11);
  RESET_CDF_COUNTER(fc->coeff_base_eob_cdf, 3);
  RESET_CDF_COUNTER(fc->coeff_base_cdf, 4);
  RESET_CDF_COUNTER(fc->coeff_br_cdf, BR_CDF_SIZE);
  RESET_CDF_COUNTER(fc->newmv_cdf, 2);
  RESET_CDF_COUNTER(fc->zeromv_cdf, 2);
  RESET_CDF_COUNTER(fc->refmv_cdf, 2);
  RESET_CDF_COUNTER(fc->drl_cdf, 2);
  RESET_CDF_COUNTER(fc->inter_compound_mode_cdf, INTER_COMPOUND_MODES);
  RESET_CDF_COUNTER(fc->compound_type_cdf, MASKED_COMPOUND_TYPES);
  RESET_CDF_COUNTER(fc->wedge_idx_cdf, 16);
  RESET_CDF_COUNTER(fc->interintra_cdf, 2);
  RESET_CDF_COUNTER(fc->wedge_interintra_cdf, 2);
  RESET_CDF_COUNTER(fc->interintra_mode_cdf, INTERINTRA_MODES);
  RESET_CDF_COUNTER(fc->motion_mode_cdf, MOTION_MODES);
  RESET_CDF_COUNTER(fc->obmc_cdf, 2);
  RESET_CDF_COUNTER(fc->palette_y_size_cdf, PALETTE_SIZES);
  RESET_CDF_COUNTER(fc->palette_uv_size_cdf, PALETTE_SIZES);
  for (int j = 0; j < PALETTE_SIZES; j++) {
    int nsymbs = j + PALETTE_MIN_SIZE;
    RESET_CDF_COUNTER_STRIDE(fc->palette_y_color_index_cdf[j], nsymbs,
                             CDF_SIZE(PALETTE_COLORS));
    RESET_CDF_COUNTER_STRIDE(fc->palette_uv_color_index_cdf[j], nsymbs,
                             CDF_SIZE(PALETTE_COLORS));
  }
  RESET_CDF_COUNTER(fc->palette_y_mode_cdf, 2);
  RESET_CDF_COUNTER(fc->palette_uv_mode_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_inter_cdf, 2);
  RESET_CDF_COUNTER(fc->single_ref_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_ref_type_cdf, 2);
  RESET_CDF_COUNTER(fc->uni_comp_ref_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_ref_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_bwdref_cdf, 2);
  RESET_CDF_COUNTER(fc->txfm_partition_cdf, 2);
  RESET_CDF_COUNTER(fc->compound_index_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_group_idx_cdf, 2);
  RESET_CDF_COUNTER(fc->skip_mode_cdfs, 2);
  RESET_CDF_COUNTER(fc->skip_txfm_cdfs, 2);
  RESET_CDF_COUNTER(fc->intra_inter_cdf, 2);
  reset_nmv_counter(&fc->nmvc);
  reset_nmv_counter(&fc->ndvc);
  RESET_CDF_COUNTER(fc->intrabc_cdf, 2);
  RESET_CDF_COUNTER(fc->seg.pred_cdf, 2);
  RESET_CDF_COUNTER(fc->seg.spatial_pred_seg_cdf, MAX_SEGMENTS);
  RESET_CDF_COUNTER(fc->filter_intra_cdfs, 2);
  RESET_CDF_COUNTER(fc->filter_intra_mode_cdf, FILTER_INTRA_MODES);
  RESET_CDF_COUNTER(fc->switchable_restore_cdf, RESTORE_SWITCHABLE_TYPES);
  RESET_CDF_COUNTER(fc->wiener_restore_cdf, 2);
  RESET_CDF_COUNTER(fc->sgrproj_restore_cdf, 2);
  RESET_CDF_COUNTER(fc->y_mode_cdf, INTRA_MODES);
  RESET_CDF_COUNTER_STRIDE(fc->uv_mode_cdf[0], UV_INTRA_MODES - 1,
                           CDF_SIZE(UV_INTRA_MODES));
  RESET_CDF_COUNTER(fc->uv_mode_cdf[1], UV_INTRA_MODES);
  for (int i = 0; i < PARTITION_CONTEXTS; i++) {
    if (i < 4) {
      RESET_CDF_COUNTER_STRIDE(fc->partition_cdf[i], 4, CDF_SIZE(10));
    } else if (i < 16) {
      RESET_CDF_COUNTER(fc->partition_cdf[i], 10);
    } else {
      RESET_CDF_COUNTER_STRIDE(fc->partition_cdf[i], 8, CDF_SIZE(10));
    }
  }
  RESET_CDF_COUNTER(fc->switchable_interp_cdf, SWITCHABLE_FILTERS);
  RESET_CDF_COUNTER(fc->kf_y_cdf, INTRA_MODES);
  RESET_CDF_COUNTER(fc->angle_delta_cdf, 2 * MAX_ANGLE_DELTA + 1);
  RESET_CDF_COUNTER_STRIDE(fc->tx_size_cdf[0], MAX_TX_DEPTH,
                           CDF_SIZE(MAX_TX_DEPTH + 1));
  RESET_CDF_COUNTER(fc->tx_size_cdf[1], MAX_TX_DEPTH + 1);
  RESET_CDF_COUNTER(fc->tx_size_cdf[2], MAX_TX_DEPTH + 1);
  RESET_CDF_COUNTER(fc->tx_size_cdf[3], MAX_TX_DEPTH + 1);
  RESET_CDF_COUNTER(fc->delta_q_cdf, DELTA_Q_PROBS + 1);
  RESET_CDF_COUNTER(fc->delta_lf_cdf, DELTA_LF_PROBS + 1);
  for (int i = 0; i < FRAME_LF_COUNT; i++) {
    RESET_CDF_COUNTER(fc->delta_lf_multi_cdf[i], DELTA_LF_PROBS + 1);
  }
  RESET_CDF_COUNTER_STRIDE(fc->intra_ext_tx_cdf[1], 7, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->intra_ext_tx_cdf[2], 5, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->inter_ext_tx_cdf[1], 16, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->inter_ext_tx_cdf[2], 12, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->inter_ext_tx_cdf[3], 2, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER(fc->cfl_sign_cdf, CFL_JOINT_SIGNS);
  RESET_CDF_COUNTER(fc->cfl_alpha_cdf, CFL_ALPHABET_SIZE);
}